

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.h
# Opt level: O0

LE_EulerAngles * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::operator=(LE_EulerAngles *this,LE_EulerAngles *param_1)

{
  KFIXED<char,_(unsigned_char)__x03_> local_88;
  KFIXED<char,_(unsigned_char)__x03_> local_78;
  KFIXED<char,_(unsigned_char)__x03_> local_68;
  KFIXED<char,_(unsigned_char)__x03_> local_58 [2];
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  KFIXED<char,_(unsigned_char)__x03_> local_28;
  LE_EulerAngles *local_18;
  LE_EulerAngles *param_1_local;
  LE_EulerAngles *this_local;
  
  local_18 = param_1;
  param_1_local = this;
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_38,&local_18->m_Psi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_28,&this->m_Psi);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_28);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_68,&local_18->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(local_58,&this->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(local_58);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_68);
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_88,&local_18->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_78,&this->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_78);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_88);
  return this;
}

Assistant:

class KDIS_EXPORT LE_EulerAngles : public DataTypeBase
{
protected:

    KFIXED8_3 m_Psi;

    KFIXED8_3 m_Theta;

    KFIXED8_3 m_Phi;

public:

    static const KUINT16 LE_EULER_ANGLES_SIZE = 3;

    LE_EulerAngles();

    // In Radians
    explicit LE_EulerAngles(KFIXED8_3 Psi, KFIXED8_3 Theta, KFIXED8_3 Phi);

    explicit LE_EulerAngles(KDataStream &stream) noexcept(false);

    ~LE_EulerAngles() override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::SetPsi
    //              KDIS::DATA_TYPE::LE_EulerAngles::GetPsi
    // Description: Radians / Degrees
    // Parameter:   KFIXED8_3, void
    //************************************
    void SetPsiInRadians( KFIXED8_3 Psi );
    KFIXED8_3 GetPsiInRadians() const;
    void SetPsiInDegrees( KFIXED8_3 Psi );
    KFIXED8_3 GetPsiInDegrees() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::SetTheta
    //              KDIS::DATA_TYPE::LE_EulerAngles::GetTheta
    // Description: Radians / Degrees
    // Parameter:   KFIXED8_3, void
    //************************************
    void SetThetaInRadians( KFIXED8_3 Theta );
    KFIXED8_3 GetThetaInRadians() const;
    void SetThetaInDegrees( KFIXED8_3 Theta );
    KFIXED8_3 GetThetaInDegrees() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::SetPhi
    //              KDIS::DATA_TYPE::LE_EulerAngles::GetPhi
    // Description: Radians / Degrees
    // Parameter:   KFIXED8_3, void
    //************************************
    void SetPhiInRadians( KFIXED8_3 Phi );
    KFIXED8_3 GetPhiInRadians() const;
    void SetPhiInDegrees( KFIXED8_3 Phi );
    KFIXED8_3 GetPhiInDegrees() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::GetAsString
    // Description: Returns a string representation.
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const LE_EulerAngles & Value ) const;
    KBOOL operator != ( const LE_EulerAngles & Value ) const;
    LE_EulerAngles operator * ( const LE_EulerAngles & Value ) const;
    LE_EulerAngles operator * ( KFLOAT64 Value ) const ;
    LE_EulerAngles operator + ( const LE_EulerAngles & Value ) const;
    LE_EulerAngles & operator += ( const LE_EulerAngles & Value );
    LE_EulerAngles operator - ( const LE_EulerAngles & Value ) const;
    LE_EulerAngles & operator -= ( const LE_EulerAngles & Value );

    // Valid values 0 - Psi, 1 - Theta, 2 - Phi. throws OUT_OF_BOUNDS exception for any other value.
    KFIXED8_3 &operator[](KUINT16 i) noexcept(false);

    const KFIXED8_3 &operator[](KUINT16 i) const noexcept(false);
}